

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O0

void __thiscall
CGL::GLScene::AreaLight::AreaLight(AreaLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  Vector3D *in_RDX;
  long in_RSI;
  SceneLight *in_RDI;
  Vector3D dim_x;
  Vector3D dim_y;
  Vector4D *in_stack_fffffffffffffd98;
  Vector3D *this_00;
  Vector4D local_238 [3];
  _func_int **local_1d8;
  _func_int **local_1d0;
  _func_int **local_1c8;
  _func_int **local_1c0;
  Vector4D local_1b8 [2];
  Vector4D *in_stack_fffffffffffffea0;
  Matrix4x4 *in_stack_fffffffffffffea8;
  _func_int **local_150;
  _func_int **local_148;
  _func_int **local_140;
  Vector3D local_138;
  Vector3D local_118;
  Vector4D local_f8 [3];
  _func_int **local_98;
  _func_int **local_90;
  _func_int **local_88;
  _func_int **local_80;
  Vector4D local_78 [2];
  _func_int **local_38;
  _func_int **local_30;
  _func_int **local_28;
  _func_int **local_20;
  Vector3D *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SceneLight::SceneLight(in_RDI);
  in_RDI->_vptr_SceneLight = (_func_int **)&PTR_get_static_light_002c6338;
  Vector3D::Vector3D((Vector3D *)(in_RDI + 2));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 6));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 10));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0xe));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0x12));
  in_RDI[2]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x50);
  in_RDI[3]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x58);
  in_RDI[4]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x60);
  in_RDI[5]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x68);
  this_00 = local_18;
  Vector4D::Vector4D(local_78,(Vector3D *)(local_10 + 0x70),1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Vector4D::to3D(in_stack_fffffffffffffd98);
  in_RDI[6]._vptr_SceneLight = local_38;
  in_RDI[7]._vptr_SceneLight = local_30;
  in_RDI[8]._vptr_SceneLight = local_28;
  in_RDI[9]._vptr_SceneLight = local_20;
  Vector4D::Vector4D(local_f8,(Vector3D *)(local_10 + 0x90),1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Vector4D::to3D(in_stack_fffffffffffffd98);
  Vector3D::operator-(this_00,(Vector3D *)in_stack_fffffffffffffd98);
  in_RDI[10]._vptr_SceneLight = local_98;
  in_RDI[0xb]._vptr_SceneLight = local_90;
  in_RDI[0xc]._vptr_SceneLight = local_88;
  in_RDI[0xd]._vptr_SceneLight = local_80;
  Vector3D::normalize(this_00);
  Vector3D::Vector3D(&local_118,(Vector3D *)(local_10 + 0xb0));
  cross(local_18,this_00);
  Vector4D::Vector4D(local_1b8,&local_138,1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Vector4D::to3D(in_stack_fffffffffffffd98);
  Vector3D::operator-(this_00,(Vector3D *)in_stack_fffffffffffffd98);
  in_RDI[0xe]._vptr_SceneLight = (_func_int **)in_stack_fffffffffffffea8;
  in_RDI[0xf]._vptr_SceneLight = local_150;
  in_RDI[0x10]._vptr_SceneLight = local_148;
  in_RDI[0x11]._vptr_SceneLight = local_140;
  Vector4D::Vector4D(local_238,&local_118,1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Vector4D::to3D(in_stack_fffffffffffffd98);
  Vector3D::operator-(this_00,(Vector3D *)in_stack_fffffffffffffd98);
  in_RDI[0x12]._vptr_SceneLight = local_1d8;
  in_RDI[0x13]._vptr_SceneLight = local_1d0;
  in_RDI[0x14]._vptr_SceneLight = local_1c8;
  in_RDI[0x15]._vptr_SceneLight = local_1c0;
  return;
}

Assistant:

AreaLight(const Collada::LightInfo& light_info, 
            const Matrix4x4& transform) {

    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction = (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();
    
    Vector3D dim_y = light_info.up;
    Vector3D dim_x = cross(light_info.up, light_info.direction);

    this->dim_x = (transform * Vector4D(dim_x, 1)).to3D() - position;
    this->dim_y = (transform * Vector4D(dim_y, 1)).to3D() - position;
  }